

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crypt.h
# Opt level: O1

void __thiscall Crypt::Crypt(Crypt *this,SequenceD<64> *k1,SequenceD<64> *k2)

{
  (this->m_k1).super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::deque<int,_std::allocator<int>_>::deque
            (&(this->m_k1).super_Sequence.m_bits,&(k1->super_Sequence).m_bits);
  (this->m_k1).super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116cc8;
  (this->m_k1).m_other._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::deque<int,_std::allocator<int>_>::deque(&(this->m_k1).m_other.m_bits,&(k1->m_other).m_bits);
  (this->m_k2).super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::deque<int,_std::allocator<int>_>::deque
            (&(this->m_k2).super_Sequence.m_bits,&(k2->super_Sequence).m_bits);
  (this->m_k2).super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116cc8;
  (this->m_k2).m_other._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::deque<int,_std::allocator<int>_>::deque(&(this->m_k2).m_other.m_bits,&(k2->m_other).m_bits);
  return;
}

Assistant:

Crypt(SequenceD<64> &k1, SequenceD<64> &k2) : m_k1(k1), m_k2(k2){}